

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O0

void raster_size(char *fn,int *x,int *y,int *a)

{
  int __fd;
  ssize_t sVar1;
  int local_50;
  int max;
  int fd;
  raster_t hd;
  int *a_local;
  int *y_local;
  int *x_local;
  char *fn_local;
  
  hd._24_8_ = a;
  __fd = open(fn,0);
  if (__fd < 1) {
    error(7);
  }
  else {
    sVar1 = read(__fd,&max,0x20);
    if (sVar1 == 0x20) {
      *x = fd;
      *y = hd.m;
      if (*y < *x) {
        local_50 = *x;
      }
      else {
        local_50 = *y;
      }
      if ((local_50 < 0x201) && (0x100 < local_50)) {
        *(undefined4 *)hd._24_8_ = 0x200;
      }
      else if ((local_50 < 0x101) && (0x80 < local_50)) {
        *(undefined4 *)hd._24_8_ = 0x100;
      }
      else if ((local_50 < 0x81) && (0x40 < local_50)) {
        *(undefined4 *)hd._24_8_ = 0x80;
      }
      else {
        error(0xe);
      }
    }
    else {
      error(6);
    }
  }
  close(__fd);
  return;
}

Assistant:

void raster_size(fn,x,y,a)
char *fn ;
int *x, *y, *a ;

{ raster_t hd ;
  int fd, max ;

  if ((fd = open(fn,O_RDONLY)) > 0) {
    if (read(fd,&hd,sizeof(hd)) == sizeof(hd)) {
      *x = hd.width ;
      *y = hd.height ;
      if (*x > *y) {
        max = *x ;
      }
      else {
        max = *y ;
      }
      if (max <= N1 && max > N2) {
        *a = N1 ;
      }
      else if (max <= N2 && max > N3) {
        *a = N2 ;
      }
      else if (max <= N3 && max > N4) {
        *a = N3 ;
      }
      else {
        error(14) ;
      }
    }
    else {
      error(6) ;
    }
  }
  else {
    error(7) ;
  }
  close(fd) ;
}